

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

vector<EvaluationState,_std::allocator<EvaluationState>_> * __thiscall
PDA::eclose(vector<EvaluationState,_std::allocator<EvaluationState>_> *__return_storage_ptr__,
           PDA *this,vector<EvaluationState,_std::allocator<EvaluationState>_> *evaluations)

{
  Transition *pTVar1;
  State *pSVar2;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *pvVar3;
  size_t sVar4;
  char input;
  pointer pEVar5;
  _Elt_pointer pbVar6;
  EvaluationState *pEVar7;
  ulong uVar8;
  pointer ppTVar9;
  vector<EvaluationState,_std::allocator<EvaluationState>_> newEvaluations;
  EvaluationState evaluation;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  EvaluationState state;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_1d8;
  vector<EvaluationState,_std::allocator<EvaluationState>_> *local_1c0;
  PDA *local_1b8;
  pointer local_1b0;
  EvaluationState *local_1a8;
  pointer local_1a0;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_198;
  _Vector_base<Transition_*,_std::allocator<Transition_*>_> local_180;
  vector<EvaluationState,_std::allocator<EvaluationState>_> local_168;
  EvaluationState local_150;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string local_a8;
  EvaluationState local_88;
  
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  pEVar5 = (evaluations->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_1c0 = __return_storage_ptr__;
  local_1b8 = this;
  while (pvVar3 = local_1c0, pEVar5 != local_1b0) {
    local_1a8 = pEVar5;
    EvaluationState::EvaluationState(&local_150,pEVar5);
    pSVar2 = local_150.currentStates;
    local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    input = getEPSILON();
    pbVar6 = local_150.stack.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_150.stack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_150.stack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pbVar6 = local_150.stack.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
    }
    std::__cxx11::string::string((string *)&local_a8,(string *)(pbVar6 + -1));
    State::getTransitionsOnInput
              ((vector<Transition_*,_std::allocator<Transition_*>_> *)&local_180,pSVar2,input,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_1a0 = local_180._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar9 = local_180._M_impl.super__Vector_impl_data._M_start; ppTVar9 != local_1a0;
        ppTVar9 = ppTVar9 + 1) {
      pTVar1 = *ppTVar9;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::deque(&local_f8,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_150);
      uVar8 = (ulong)((long)(pTVar1->stackPush).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar1->stackPush).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
      while( true ) {
        uVar8 = uVar8 - 1;
        if ((int)(uint)uVar8 < 0) break;
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_f8,
                    (pTVar1->stackPush).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + ((uint)uVar8 & 0x7fffffff));
      }
      pSVar2 = pTVar1->stateTo;
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,&local_f8);
      local_88.currentStates = pSVar2;
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::emplace_back<EvaluationState>
                (&local_1d8,&local_88);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&local_f8);
    }
    std::_Vector_base<Transition_*,_std::allocator<Transition_*>_>::~_Vector_base(&local_180);
    if (local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1d8.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::vector(&local_168,&local_1d8);
      eclose((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_f8,local_1b8,
             &local_168);
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_168);
      sVar4 = local_f8.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size;
      for (pEVar7 = (EvaluationState *)
                    local_f8.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map; pEVar7 != (EvaluationState *)sVar4;
          pEVar7 = pEVar7 + 1) {
        EvaluationState::EvaluationState(&local_88,pEVar7);
        std::vector<EvaluationState,std::allocator<EvaluationState>>::emplace_back<EvaluationState&>
                  ((vector<EvaluationState,std::allocator<EvaluationState>> *)&local_198,&local_88);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
      }
      std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector
                ((vector<EvaluationState,_std::allocator<EvaluationState>_> *)&local_f8);
    }
    std::vector<EvaluationState,std::allocator<EvaluationState>>::emplace_back<EvaluationState&>
              ((vector<EvaluationState,std::allocator<EvaluationState>> *)&local_198,&local_150);
    std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_1d8);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_150);
    pEVar5 = local_1a8 + 1;
  }
  (local_1c0->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_1c0->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_1c0->super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<EvaluationState,_std::allocator<EvaluationState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EvaluationState,_std::allocator<EvaluationState>_>::~vector(&local_198);
  return pvVar3;
}

Assistant:

std::vector<EvaluationState> PDA::eclose(std::vector<EvaluationState> evaluations) {
    bool addedSomething = false;
    std::vector<EvaluationState> newEvaluations;
    for (EvaluationState evaluation: evaluations) {
        std::vector<EvaluationState> recentEvaluations = {};
        for (Transition *transition: evaluation.currentStates->getTransitionsOnInput(getEPSILON(), evaluation.stack.top())) {
            std::stack<std::string> newStack = evaluation.stack;
            for (int j = transition->getStackPush().size() - 1; j >= 0; --j) {
//                if (transition->getStackPush()[j] != "e") { // e is epsilon, so nothing has to be pushed then
                    newStack.push(transition->getStackPush()[j]);
//                }
            }
            recentEvaluations.emplace_back(EvaluationState(newStack, transition->getStateTo()));
        }

        if (recentEvaluations.size() > 0) {
            for (EvaluationState state: eclose(recentEvaluations)) {
                newEvaluations.emplace_back(state);
            }
        }
        newEvaluations.emplace_back(evaluation);
    }
    if (!addedSomething) {
        return newEvaluations;
    }

    return eclose(newEvaluations);
}